

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_entropy.c
# Opt level: O0

void accumulate_local_observations
               (int *src,int *dst,int *back,size_t l,size_t n,size_t m,int b,size_t k,
               inform_dist *states,inform_dist *histories,inform_dist *sources,
               inform_dist *predicates,int *state,int *history,int *source,int *predicate)

{
  int iVar1;
  long lVar2;
  int future;
  int src_state;
  size_t u;
  int back_state;
  size_t z;
  size_t j_1;
  size_t j;
  ulong uStack_40;
  int q;
  size_t i;
  size_t m_local;
  size_t n_local;
  size_t l_local;
  int *back_local;
  int *dst_local;
  int *src_local;
  
  back_local = dst;
  dst_local = src;
  for (uStack_40 = 0; uStack_40 < n; uStack_40 = uStack_40 + 1) {
    *history = 0;
    j._4_4_ = 1;
    for (j_1 = 0; j_1 < k; j_1 = j_1 + 1) {
      j._4_4_ = b * j._4_4_;
      *history = b * *history;
      *history = back_local[j_1] + *history;
    }
    for (z = k; z < m; z = z + 1) {
      lVar2 = z - k;
      u._4_4_ = 0;
      for (_future = 0; _future < l; _future = _future + 1) {
        u._4_4_ = b * u._4_4_ + back[z + n * (uStack_40 + m * _future) + -1];
      }
      history[lVar2] = u._4_4_ * j._4_4_ + history[lVar2];
      iVar1 = dst_local[z - 1];
      predicate[lVar2] = history[lVar2] * b + back_local[z];
      state[lVar2] = predicate[lVar2] * b + iVar1;
      source[lVar2] = history[lVar2] * b + iVar1;
      states->histogram[state[lVar2]] = states->histogram[state[lVar2]] + 1;
      histories->histogram[history[lVar2]] = histories->histogram[history[lVar2]] + 1;
      sources->histogram[source[lVar2]] = sources->histogram[source[lVar2]] + 1;
      predicates->histogram[predicate[lVar2]] = predicates->histogram[predicate[lVar2]] + 1;
      if (z + 1 != m) {
        history[lVar2 + 1] = predicate[lVar2] - (back_local[lVar2] + u._4_4_ * b) * j._4_4_;
      }
    }
    dst_local = dst_local + m;
    back_local = back_local + m;
    state = state + (m - k);
    history = history + (m - k);
    source = source + (m - k);
    predicate = predicate + (m - k);
  }
  return;
}

Assistant:

static void accumulate_local_observations(int const* series, size_t n, size_t m,
    int b, size_t k, inform_dist *states, int *state)
{
    k -= 1;
    for (size_t i = 0; i < n; ++i)
    {
        int history = 0, q = 1;
        for (size_t j = 0; j < k; ++j)
        {
            q *= b;
            history *= b;
            history += series[j];
        }
        for (size_t j = k; j < m; ++j)
        {
            size_t l = j - k;
            state[l] = history * b + series[j];

            states->histogram[state[l]]++;

            if (j + 1 != m)
                history = state[l] - series[l]*q;
        }
        series += m;
        state += (m - k);
    }
}